

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read.c
# Opt level: O2

int64_t archive_seek_data(archive *_a,int64_t offset,int whence)

{
  int iVar1;
  int64_t iVar2;
  
  iVar1 = __archive_check_magic(_a,0xdeb0c5,4,"archive_seek_data_block");
  if (iVar1 != -0x1e) {
    if (*(code **)(_a[0x15].archive_format_name + 0x38) != (code *)0x0) {
      iVar2 = (**(code **)(_a[0x15].archive_format_name + 0x38))(_a,offset,whence);
      return iVar2;
    }
    archive_set_error(_a,0x16,"Internal error: No format_seek_data_block function registered");
  }
  return -0x1e;
}

Assistant:

int64_t
archive_seek_data(struct archive *_a, int64_t offset, int whence)
{
	struct archive_read *a = (struct archive_read *)_a;
	archive_check_magic(_a, ARCHIVE_READ_MAGIC, ARCHIVE_STATE_DATA,
	    "archive_seek_data_block");

	if (a->format->seek_data == NULL) {
		archive_set_error(&a->archive, ARCHIVE_ERRNO_PROGRAMMER,
		    "Internal error: "
		    "No format_seek_data_block function registered");
		return (ARCHIVE_FATAL);
	}

	return (a->format->seek_data)(a, offset, whence);
}